

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GetterReturnType_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  Presence PVar2;
  
  BVar1 = (field->value).type.base_type;
  GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&(field->value).type);
  PVar2 = field->presence;
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc && PVar2 == kOptional) ||
     ((PVar2 != kRequired &&
      (((BVar1 - BASE_TYPE_STRUCT < 2 || (BVar1 == BASE_TYPE_STRING)) ||
       ((BVar1 == BASE_TYPE_VECTOR &&
        ((PVar2 != kRequired && (0xb < (field->value).type.element - BASE_TYPE_UTYPE)))))))))) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetterReturnType(const FieldDef &field) const {
    auto base_type = field.value.type.base_type;

    auto r_type = GenTypeGet(field.value.type);
    if (field.IsScalarOptional() ||
        // string, structs and unions
        (!field.IsRequired() &&
         (base_type == BASE_TYPE_STRING || base_type == BASE_TYPE_STRUCT ||
          base_type == BASE_TYPE_UNION)) ||
        // vector of anything not scalar
        (base_type == BASE_TYPE_VECTOR && !field.IsRequired() &&
         !IsScalar(field.value.type.VectorType().base_type))) {
      r_type += "?";
    }
    return r_type;
  }